

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int x509_get_hash_alg(mbedtls_x509_buf *alg,mbedtls_md_type_t *md_alg)

{
  int iVar1;
  byte *end;
  uchar *p;
  size_t len;
  mbedtls_x509_buf md_oid;
  byte *local_38;
  size_t local_30;
  mbedtls_asn1_buf local_28;
  
  iVar1 = -0x2362;
  if (alg->tag == 0x30) {
    local_38 = alg->p;
    if ((long)alg->len < 1) {
      iVar1 = -0x2360;
    }
    else {
      end = local_38 + alg->len;
      local_28.tag = (int)*local_38;
      iVar1 = mbedtls_asn1_get_tag(&local_38,end,&local_28.len,6);
      if (iVar1 == 0) {
        local_28.p = local_38;
        local_38 = local_38 + local_28.len;
        iVar1 = mbedtls_oid_get_md_alg(&local_28,md_alg);
        if (iVar1 == 0) {
          if (local_38 == end) {
            return 0;
          }
          iVar1 = mbedtls_asn1_get_tag(&local_38,end,&local_30,5);
          if ((iVar1 == 0) && (local_30 == 0)) {
            if (local_38 != end) {
              return -0x2366;
            }
            return 0;
          }
        }
      }
      iVar1 = iVar1 + -0x2300;
    }
  }
  return iVar1;
}

Assistant:

static int x509_get_hash_alg( const mbedtls_x509_buf *alg, mbedtls_md_type_t *md_alg )
{
    int ret;
    unsigned char *p;
    const unsigned char *end;
    mbedtls_x509_buf md_oid;
    size_t len;

    /* Make sure we got a SEQUENCE and setup bounds */
    if( alg->tag != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    p = (unsigned char *) alg->p;
    end = p + alg->len;

    if( p >= end )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    /* Parse md_oid */
    md_oid.tag = *p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &md_oid.len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    md_oid.p = p;
    p += md_oid.len;

    /* Get md_alg from md_oid */
    if( ( ret = mbedtls_oid_get_md_alg( &md_oid, md_alg ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    /* Make sure params is absent of NULL */
    if( p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_NULL ) ) != 0 || len != 0 )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p != end )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}